

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

bool spvIsValidID(char *textValue)

{
  bool bVar1;
  char *local_20;
  char *c;
  char *textValue_local;
  
  local_20 = textValue;
  while( true ) {
    if (*local_20 == '\0') {
      return local_20 != textValue;
    }
    bVar1 = spvIsValidIDCharacter(*local_20);
    if (!bVar1) break;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

bool spvIsValidID(const char* textValue) {
  const char* c = textValue;
  for (; *c != '\0'; ++c) {
    if (!spvIsValidIDCharacter(*c)) {
      return false;
    }
  }
  // If the string was empty, then the ID also is not valid.
  return c != textValue;
}